

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void ClearContent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *content,
               vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *backtraces,
               unsigned_long *endContentPosition)

{
  size_type sVar1;
  size_type sVar2;
  unsigned_long *endContentPosition_local;
  vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *backtraces_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  
  sVar2 = *endContentPosition;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(content);
  if (sVar2 == sVar1) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(content);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(content,sVar2 + 1);
    sVar2 = std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::size(backtraces)
    ;
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::resize
              (backtraces,sVar2 + 1);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(content);
    *endContentPosition = sVar2;
    return;
  }
  __assert_fail("endContentPosition == content.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmStateDirectory.cxx"
                ,0xf0,
                "void ClearContent(T &, U &, V &) [T = std::vector<std::basic_string<char>>, U = std::vector<cmListFileBacktrace>, V = unsigned long]"
               );
}

Assistant:

void ClearContent(T& content, U& backtraces, V& endContentPosition)
{
  assert(endContentPosition == content.size());

  content.resize(content.size() + 1);
  backtraces.resize(backtraces.size() + 1);

  endContentPosition = content.size();
}